

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.c
# Opt level: O2

void process_arg(ArgumentState *arg_state,int i,char ***argv)

{
  char cVar1;
  ArgumentDescription *pAVar2;
  int iVar3;
  uint *puVar4;
  long lVar5;
  size_t sVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  double dVar11;
  
  pAVar2 = arg_state->desc;
  if (pAVar2[i].type != (char *)0x0) {
    cVar1 = *pAVar2[i].type;
    if (cVar1 == '+') {
      *(int *)pAVar2[i].location = *pAVar2[i].location + 1;
    }
    else {
      if (cVar1 == 'f') {
LAB_00141660:
        bVar10 = cVar1 == 'F';
        puVar4 = (uint *)pAVar2[i].location;
      }
      else {
        if (cVar1 != 'T') {
          if (cVar1 != 'F') {
            pcVar8 = **argv;
            pcVar9 = pcVar8 + 1;
            **argv = pcVar9;
            ppcVar7 = *argv;
            if (pcVar8[1] == '\0') {
              ppcVar7 = ppcVar7 + 1;
              *argv = ppcVar7;
            }
            pcVar8 = *ppcVar7;
            if (pcVar8 == (char *)0x0) {
              usage(arg_state,pcVar9);
LAB_00141766:
              fprintf(_stderr,"%s:bad argument description\n",arg_state->program_name);
              exit(1);
            }
            pcVar9 = pcVar8;
            if (cVar1 == 'D') {
              dVar11 = atof(pcVar8);
              *(double *)pAVar2[i].location = dVar11;
            }
            else if (cVar1 == 'S') {
              pcVar9 = (char *)pAVar2[i].location;
              iVar3 = atoi(pAVar2[i].type + 1);
              strncpy(pcVar9,pcVar8,(long)iVar3);
              ppcVar7 = *argv;
              pcVar9 = *ppcVar7;
            }
            else if (cVar1 == 'L') {
              lVar5 = atol(pcVar8);
              *(long *)pAVar2[i].location = lVar5;
            }
            else {
              if (cVar1 != 'I') goto LAB_00141766;
              iVar3 = atoi(pcVar8);
              *(int *)pAVar2[i].location = iVar3;
            }
            sVar6 = strlen(pcVar9);
            *ppcVar7 = pcVar9 + (sVar6 - 1);
            goto LAB_00141687;
          }
          goto LAB_00141660;
        }
        puVar4 = (uint *)pAVar2[i].location;
        bVar10 = *puVar4 == 0;
      }
      *puVar4 = (uint)bVar10;
    }
  }
  pcVar8 = (char *)0x0;
LAB_00141687:
  if (pAVar2[i].pfn == (ArgumentFunction *)0x0) {
    return;
  }
  (*pAVar2[i].pfn)(arg_state,pcVar8);
  return;
}

Assistant:

void process_arg(ArgumentState *arg_state, int i, char ***argv) {
  char *arg = NULL;
  ArgumentDescription *desc = arg_state->desc;
  if (desc[i].type) {
    char type = desc[i].type[0];
    if (type == 'F' || type == 'f')
      *(int *)desc[i].location = type == 'F' ? 1 : 0;
    else if (type == 'T')
      *(int *)desc[i].location = !*(int *)desc[i].location;
    else if (type == '+')
      (*(int *)desc[i].location)++;
    else {
      arg = *++(**argv) ? **argv : *++(*argv);
      if (!arg) usage(arg_state, NULL);
      switch (type) {
        case 'I':
          *(int *)desc[i].location = atoi(arg);
          break;
        case 'D':
          *(double *)desc[i].location = atof(arg);
          break;
        case 'L':
          *(int64 *)desc[i].location = atoll(arg);
          break;
        case 'S':
          strncpy((char *)desc[i].location, arg, atoi(desc[i].type + 1));
          break;
        default:
          fprintf(stderr, "%s:bad argument description\n", arg_state->program_name);
          exit(1);
          break;
      }
      **argv += strlen(**argv) - 1;
    }
  }
  if (desc[i].pfn) desc[i].pfn(arg_state, arg);
}